

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int addk(FuncState *fs,TValue *key,TValue *v)

{
  byte bVar1;
  Proto *o;
  lua_State *L;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  TValue *pTVar31;
  long lVar32;
  long lVar33;
  lu_byte *plVar34;
  ulong uVar35;
  Value VVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar60;
  int iVar61;
  undefined1 auVar58 [16];
  int iVar62;
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar76;
  int iVar80;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  TValue val;
  Value local_40;
  undefined1 local_38;
  
  o = fs->f;
  L = fs->ls->L;
  pTVar31 = luaH_get(fs->ls->h,key);
  if ((pTVar31->tt_ == '\x03') && (iVar37 = (int)(pTVar31->value_).i, iVar37 < fs->nk)) {
    if ((((v->tt_ ^ o->k[iVar37].tt_) & 0x3f) == 0) &&
       (iVar30 = luaV_equalobj((lua_State *)0x0,o->k + iVar37,v), iVar30 != 0)) {
      return iVar37;
    }
  }
  iVar37 = o->sizek;
  iVar30 = fs->nk;
  VVar36 = (Value)(long)iVar30;
  local_38 = 3;
  local_40 = VVar36;
  luaH_finishset(L,fs->ls->h,key,pTVar31,(TValue *)&local_40);
  pTVar31 = (TValue *)luaM_growaux_(L,o->k,iVar30,&o->sizek,0x10,0x1ffffff,"constants");
  o->k = pTVar31;
  auVar29 = _DAT_0016bb10;
  auVar28 = _DAT_0016bb00;
  auVar27 = _DAT_0016baf0;
  auVar26 = _DAT_0016bae0;
  auVar25 = _DAT_0016bad0;
  auVar24 = _DAT_0016bac0;
  auVar23 = _DAT_00164360;
  if (iVar37 < o->sizek) {
    lVar32 = (long)o->sizek - (long)iVar37;
    lVar33 = lVar32 + -1;
    auVar38._8_4_ = (int)lVar33;
    auVar38._0_8_ = lVar33;
    auVar38._12_4_ = (int)((ulong)lVar33 >> 0x20);
    plVar34 = &pTVar31[(long)iVar37 + 0xf].tt_;
    uVar35 = 0;
    do {
      auVar56._8_4_ = (int)uVar35;
      auVar56._0_8_ = uVar35;
      auVar56._12_4_ = (int)(uVar35 >> 0x20);
      auVar58 = auVar38 ^ auVar23;
      auVar63 = (auVar56 | auVar29) ^ auVar23;
      iVar37 = auVar58._0_4_;
      iVar76 = -(uint)(iVar37 < auVar63._0_4_);
      iVar60 = auVar58._4_4_;
      auVar65._4_4_ = -(uint)(iVar60 < auVar63._4_4_);
      iVar61 = auVar58._8_4_;
      iVar80 = -(uint)(iVar61 < auVar63._8_4_);
      iVar62 = auVar58._12_4_;
      auVar65._12_4_ = -(uint)(iVar62 < auVar63._12_4_);
      auVar39._4_4_ = iVar76;
      auVar39._0_4_ = iVar76;
      auVar39._8_4_ = iVar80;
      auVar39._12_4_ = iVar80;
      auVar39 = pshuflw(in_XMM1,auVar39,0xe8);
      auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar60);
      auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar62);
      auVar64._0_4_ = auVar64._4_4_;
      auVar64._8_4_ = auVar64._12_4_;
      auVar48 = pshuflw(in_XMM2,auVar64,0xe8);
      auVar65._0_4_ = auVar65._4_4_;
      auVar65._8_4_ = auVar65._12_4_;
      auVar63 = pshuflw(auVar39,auVar65,0xe8);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar63 | auVar48 & auVar39) ^ auVar58;
      auVar58 = packssdw(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar34[-0xf0] = 0;
      }
      auVar48._4_4_ = iVar76;
      auVar48._0_4_ = iVar76;
      auVar48._8_4_ = iVar80;
      auVar48._12_4_ = iVar80;
      auVar65 = auVar64 & auVar48 | auVar65;
      auVar58 = packssdw(auVar65,auVar65);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar63,auVar58 ^ auVar63);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._0_4_ >> 8 & 1) != 0) {
        plVar34[-0xe0] = 0;
      }
      auVar58 = (auVar56 | auVar28) ^ auVar23;
      auVar49._0_4_ = -(uint)(iVar37 < auVar58._0_4_);
      auVar49._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar49._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar49._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar66._4_4_ = auVar49._0_4_;
      auVar66._0_4_ = auVar49._0_4_;
      auVar66._8_4_ = auVar49._8_4_;
      auVar66._12_4_ = auVar49._8_4_;
      iVar76 = -(uint)(auVar58._4_4_ == iVar60);
      iVar80 = -(uint)(auVar58._12_4_ == iVar62);
      auVar11._4_4_ = iVar76;
      auVar11._0_4_ = iVar76;
      auVar11._8_4_ = iVar80;
      auVar11._12_4_ = iVar80;
      auVar77._4_4_ = auVar49._4_4_;
      auVar77._0_4_ = auVar49._4_4_;
      auVar77._8_4_ = auVar49._12_4_;
      auVar77._12_4_ = auVar49._12_4_;
      auVar58 = auVar11 & auVar66 | auVar77;
      auVar58 = packssdw(auVar58,auVar58);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar2,auVar58 ^ auVar2);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._0_4_ >> 0x10 & 1) != 0) {
        plVar34[-0xd0] = 0;
      }
      auVar58 = pshufhw(auVar58,auVar66,0x84);
      auVar12._4_4_ = iVar76;
      auVar12._0_4_ = iVar76;
      auVar12._8_4_ = iVar80;
      auVar12._12_4_ = iVar80;
      auVar63 = pshufhw(auVar49,auVar12,0x84);
      auVar39 = pshufhw(auVar58,auVar77,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar39 | auVar63 & auVar58) ^ auVar40;
      auVar58 = packssdw(auVar40,auVar40);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._0_4_ >> 0x18 & 1) != 0) {
        plVar34[-0xc0] = 0;
      }
      auVar58 = (auVar56 | auVar27) ^ auVar23;
      auVar50._0_4_ = -(uint)(iVar37 < auVar58._0_4_);
      auVar50._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar50._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar50._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar13._4_4_ = auVar50._0_4_;
      auVar13._0_4_ = auVar50._0_4_;
      auVar13._8_4_ = auVar50._8_4_;
      auVar13._12_4_ = auVar50._8_4_;
      auVar63 = pshuflw(auVar77,auVar13,0xe8);
      auVar41._0_4_ = -(uint)(auVar58._0_4_ == iVar37);
      auVar41._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
      auVar41._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
      auVar41._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
      auVar67._4_4_ = auVar41._4_4_;
      auVar67._0_4_ = auVar41._4_4_;
      auVar67._8_4_ = auVar41._12_4_;
      auVar67._12_4_ = auVar41._12_4_;
      auVar58 = pshuflw(auVar41,auVar67,0xe8);
      auVar68._4_4_ = auVar50._4_4_;
      auVar68._0_4_ = auVar50._4_4_;
      auVar68._8_4_ = auVar50._12_4_;
      auVar68._12_4_ = auVar50._12_4_;
      auVar39 = pshuflw(auVar50,auVar68,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 & auVar63,(auVar39 | auVar58 & auVar63) ^ auVar3);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar34[-0xb0] = 0;
      }
      auVar14._4_4_ = auVar50._0_4_;
      auVar14._0_4_ = auVar50._0_4_;
      auVar14._8_4_ = auVar50._8_4_;
      auVar14._12_4_ = auVar50._8_4_;
      auVar68 = auVar67 & auVar14 | auVar68;
      auVar39 = packssdw(auVar68,auVar68);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58,auVar39 ^ auVar4);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._4_2_ >> 8 & 1) != 0) {
        plVar34[-0xa0] = 0;
      }
      auVar58 = (auVar56 | auVar26) ^ auVar23;
      auVar51._0_4_ = -(uint)(iVar37 < auVar58._0_4_);
      auVar51._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar51._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar51._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar69._4_4_ = auVar51._0_4_;
      auVar69._0_4_ = auVar51._0_4_;
      auVar69._8_4_ = auVar51._8_4_;
      auVar69._12_4_ = auVar51._8_4_;
      iVar76 = -(uint)(auVar58._4_4_ == iVar60);
      iVar80 = -(uint)(auVar58._12_4_ == iVar62);
      auVar15._4_4_ = iVar76;
      auVar15._0_4_ = iVar76;
      auVar15._8_4_ = iVar80;
      auVar15._12_4_ = iVar80;
      auVar78._4_4_ = auVar51._4_4_;
      auVar78._0_4_ = auVar51._4_4_;
      auVar78._8_4_ = auVar51._12_4_;
      auVar78._12_4_ = auVar51._12_4_;
      auVar58 = auVar15 & auVar69 | auVar78;
      auVar58 = packssdw(auVar58,auVar58);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar5,auVar58 ^ auVar5);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar34[-0x90] = 0;
      }
      auVar58 = pshufhw(auVar58,auVar69,0x84);
      auVar16._4_4_ = iVar76;
      auVar16._0_4_ = iVar76;
      auVar16._8_4_ = iVar80;
      auVar16._12_4_ = iVar80;
      auVar63 = pshufhw(auVar51,auVar16,0x84);
      auVar39 = pshufhw(auVar58,auVar78,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar39 | auVar63 & auVar58) ^ auVar42;
      auVar58 = packssdw(auVar42,auVar42);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._6_2_ >> 8 & 1) != 0) {
        plVar34[-0x80] = 0;
      }
      auVar58 = (auVar56 | auVar25) ^ auVar23;
      auVar52._0_4_ = -(uint)(iVar37 < auVar58._0_4_);
      auVar52._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar52._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar52._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar17._4_4_ = auVar52._0_4_;
      auVar17._0_4_ = auVar52._0_4_;
      auVar17._8_4_ = auVar52._8_4_;
      auVar17._12_4_ = auVar52._8_4_;
      auVar63 = pshuflw(auVar78,auVar17,0xe8);
      auVar43._0_4_ = -(uint)(auVar58._0_4_ == iVar37);
      auVar43._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
      auVar43._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
      auVar43._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
      auVar70._4_4_ = auVar43._4_4_;
      auVar70._0_4_ = auVar43._4_4_;
      auVar70._8_4_ = auVar43._12_4_;
      auVar70._12_4_ = auVar43._12_4_;
      auVar58 = pshuflw(auVar43,auVar70,0xe8);
      auVar71._4_4_ = auVar52._4_4_;
      auVar71._0_4_ = auVar52._4_4_;
      auVar71._8_4_ = auVar52._12_4_;
      auVar71._12_4_ = auVar52._12_4_;
      auVar39 = pshuflw(auVar52,auVar71,0xe8);
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar53 = (auVar39 | auVar58 & auVar63) ^ auVar53;
      auVar39 = packssdw(auVar53,auVar53);
      auVar58 = packsswb(auVar58 & auVar63,auVar39);
      if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar34[-0x70] = 0;
      }
      auVar18._4_4_ = auVar52._0_4_;
      auVar18._0_4_ = auVar52._0_4_;
      auVar18._8_4_ = auVar52._8_4_;
      auVar18._12_4_ = auVar52._8_4_;
      auVar71 = auVar70 & auVar18 | auVar71;
      auVar39 = packssdw(auVar71,auVar71);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar6,auVar39 ^ auVar6);
      auVar58 = packsswb(auVar58,auVar39);
      if ((auVar58._8_2_ >> 8 & 1) != 0) {
        plVar34[-0x60] = 0;
      }
      auVar58 = (auVar56 | auVar24) ^ auVar23;
      auVar54._0_4_ = -(uint)(iVar37 < auVar58._0_4_);
      auVar54._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar54._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar54._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar72._4_4_ = auVar54._0_4_;
      auVar72._0_4_ = auVar54._0_4_;
      auVar72._8_4_ = auVar54._8_4_;
      auVar72._12_4_ = auVar54._8_4_;
      iVar76 = -(uint)(auVar58._4_4_ == iVar60);
      iVar80 = -(uint)(auVar58._12_4_ == iVar62);
      auVar19._4_4_ = iVar76;
      auVar19._0_4_ = iVar76;
      auVar19._8_4_ = iVar80;
      auVar19._12_4_ = iVar80;
      auVar79._4_4_ = auVar54._4_4_;
      auVar79._0_4_ = auVar54._4_4_;
      auVar79._8_4_ = auVar54._12_4_;
      auVar79._12_4_ = auVar54._12_4_;
      auVar58 = auVar19 & auVar72 | auVar79;
      auVar58 = packssdw(auVar58,auVar58);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar7,auVar58 ^ auVar7);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        plVar34[-0x50] = 0;
      }
      auVar58 = pshufhw(auVar58,auVar72,0x84);
      auVar20._4_4_ = iVar76;
      auVar20._0_4_ = iVar76;
      auVar20._8_4_ = iVar80;
      auVar20._12_4_ = iVar80;
      auVar63 = pshufhw(auVar54,auVar20,0x84);
      auVar39 = pshufhw(auVar58,auVar79,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar39 | auVar63 & auVar58) ^ auVar44;
      auVar58 = packssdw(auVar44,auVar44);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._10_2_ >> 8 & 1) != 0) {
        plVar34[-0x40] = 0;
      }
      auVar58 = (auVar56 | _DAT_0016bab0) ^ auVar23;
      auVar55._0_4_ = -(uint)(iVar37 < auVar58._0_4_);
      auVar55._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar55._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar55._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar21._4_4_ = auVar55._0_4_;
      auVar21._0_4_ = auVar55._0_4_;
      auVar21._8_4_ = auVar55._8_4_;
      auVar21._12_4_ = auVar55._8_4_;
      auVar63 = pshuflw(auVar79,auVar21,0xe8);
      auVar45._0_4_ = -(uint)(auVar58._0_4_ == iVar37);
      auVar45._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
      auVar45._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
      auVar45._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
      auVar73._4_4_ = auVar45._4_4_;
      auVar73._0_4_ = auVar45._4_4_;
      auVar73._8_4_ = auVar45._12_4_;
      auVar73._12_4_ = auVar45._12_4_;
      auVar58 = pshuflw(auVar45,auVar73,0xe8);
      auVar74._4_4_ = auVar55._4_4_;
      auVar74._0_4_ = auVar55._4_4_;
      auVar74._8_4_ = auVar55._12_4_;
      auVar74._12_4_ = auVar55._12_4_;
      auVar39 = pshuflw(auVar55,auVar74,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 & auVar63,(auVar39 | auVar58 & auVar63) ^ auVar8);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar34[-0x30] = 0;
      }
      auVar22._4_4_ = auVar55._0_4_;
      auVar22._0_4_ = auVar55._0_4_;
      auVar22._8_4_ = auVar55._8_4_;
      auVar22._12_4_ = auVar55._8_4_;
      auVar74 = auVar73 & auVar22 | auVar74;
      auVar39 = packssdw(auVar74,auVar74);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58,auVar39 ^ auVar9);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._12_2_ >> 8 & 1) != 0) {
        plVar34[-0x20] = 0;
      }
      auVar58 = (auVar56 | _DAT_0016baa0) ^ auVar23;
      auVar46._0_4_ = -(uint)(iVar37 < auVar58._0_4_);
      auVar46._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar46._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar46._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar75._4_4_ = auVar46._0_4_;
      auVar75._0_4_ = auVar46._0_4_;
      auVar75._8_4_ = auVar46._8_4_;
      auVar75._12_4_ = auVar46._8_4_;
      auVar57._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
      auVar57._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
      auVar57._0_4_ = auVar57._4_4_;
      auVar57._8_4_ = auVar57._12_4_;
      auVar59._4_4_ = auVar46._4_4_;
      auVar59._0_4_ = auVar46._4_4_;
      auVar59._8_4_ = auVar46._12_4_;
      auVar59._12_4_ = auVar46._12_4_;
      auVar39 = auVar57 & auVar75 | auVar59;
      auVar58 = packssdw(auVar46,auVar39);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar10,auVar58 ^ auVar10);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar34[-0x10] = 0;
      }
      auVar58 = pshufhw(auVar58,auVar75,0x84);
      in_XMM2 = pshufhw(auVar39,auVar57,0x84);
      in_XMM2 = in_XMM2 & auVar58;
      auVar58 = pshufhw(auVar58,auVar59,0x84);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar58 | in_XMM2) ^ auVar47;
      auVar58 = packssdw(auVar47,auVar47);
      in_XMM1 = packsswb(auVar58,auVar58);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *plVar34 = '\0';
      }
      uVar35 = uVar35 + 0x10;
      plVar34 = plVar34 + 0x100;
    } while ((lVar32 + 0xfU & 0xfffffffffffffff0) != uVar35);
  }
  pTVar31[VVar36.i].value_ = v->value_;
  bVar1 = v->tt_;
  pTVar31[VVar36.i].tt_ = bVar1;
  fs->nk = fs->nk + 1;
  if ((((bVar1 & 0x40) != 0) && ((o->marked & 0x20) != 0)) &&
     ((((v->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(v->value_).gc);
  }
  return iVar30;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  TValue val;
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  const TValue *idx = luaH_get(fs->ls->h, key);  /* query scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttypetag(&f->k[k]) == ttypetag(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(&val, k);
  luaH_finishset(L, fs->ls->h, key, idx, &val);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}